

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

string * __thiscall
cmCoreTryCompile::WriteSource
          (string *__return_storage_ptr__,cmCoreTryCompile *this,string *filename,string *content,
          char *command)

{
  cmAlphaNum *this_00;
  string filepath;
  string local_2b0;
  cmAlphaNum local_290;
  cmAlphaNum local_260;
  ofstream file;
  
  cmsys::SystemTools::GetFilenamePath((string *)&file,filename);
  std::__cxx11::string::~string((string *)&file);
  if (file.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != 0) {
    file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)strlen(command);
    local_260.View_._M_len = 0x19;
    local_260.View_._M_str = " given invalid filename \"";
    file.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = command;
    cmStrCat<std::__cxx11::string,char[2]>
              ((string *)&local_290,(cmAlphaNum *)&file,&local_260,filename,(char (*) [2])0x64cbec);
    cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,(string *)&local_290);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    this_00 = &local_290;
    goto LAB_0044077c;
  }
  file.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (this->BinaryDirectory)._M_dataplus._M_p;
  file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)(this->BinaryDirectory)._M_string_length;
  local_260.View_._M_len = 1;
  local_260.View_._M_str = "/";
  cmStrCat<std::__cxx11::string>(&filepath,(cmAlphaNum *)&file,&local_260,filename);
  std::ofstream::ofstream(&file,filepath._M_dataplus._M_p,_S_out);
  if (((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      == 0) {
    std::operator<<(&file.super_basic_ostream<char,_std::char_traits<char>_>,(string *)content);
    if (((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5
        ) != 0) {
      local_260.View_._M_len = strlen(command);
      local_290.View_._M_len = 0x12;
      local_290.View_._M_str = " failed to write \"";
      local_260.View_._M_str = command;
      cmStrCat<std::__cxx11::string,char[2]>
                (&local_2b0,&local_260,&local_290,filename,(char (*) [2])0x64cbec);
      cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,&local_2b0);
      goto LAB_0044074f;
    }
    std::ofstream::close();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filepath._M_dataplus._M_p == &filepath.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(filepath.field_2._M_allocated_capacity._1_7_,filepath.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = filepath.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = filepath._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(filepath.field_2._M_allocated_capacity._1_7_,filepath.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = filepath._M_string_length;
    filepath._M_string_length = 0;
    filepath.field_2._M_local_buf[0] = '\0';
    filepath._M_dataplus._M_p = (pointer)&filepath.field_2;
  }
  else {
    local_260.View_._M_len = strlen(command);
    local_290.View_._M_len = (size_t)&DAT_00000011;
    local_290.View_._M_str = " failed to open \"";
    local_260.View_._M_str = command;
    cmStrCat<std::__cxx11::string,char[14]>
              (&local_2b0,&local_260,&local_290,filename,(char (*) [14])"\" for writing");
    cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,&local_2b0);
LAB_0044074f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  std::ofstream::~ofstream(&file);
  this_00 = (cmAlphaNum *)&filepath;
LAB_0044077c:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCoreTryCompile::WriteSource(std::string const& filename,
                                          std::string const& content,
                                          char const* command) const
{
  if (!cmSystemTools::GetFilenamePath(filename).empty()) {
    const auto& msg =
      cmStrCat(command, " given invalid filename \"", filename, "\"");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  auto filepath = cmStrCat(this->BinaryDirectory, "/", filename);
  cmsys::ofstream file{ filepath.c_str(), std::ios::out };
  if (!file) {
    const auto& msg =
      cmStrCat(command, " failed to open \"", filename, "\" for writing");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  file << content;
  if (!file) {
    const auto& msg = cmStrCat(command, " failed to write \"", filename, "\"");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  file.close();
  return filepath;
}